

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_size_isos_dim<3>(Omega_h *this,Reals *metrics)

{
  Alloc *pAVar1;
  int size_in;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  allocator local_59;
  type f;
  Write<double> out;
  Write<signed_char> local_28;
  
  pAVar1 = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  size_in = divide_no_remainder<int>((int)(sVar2 >> 3),6);
  std::__cxx11::string::string((string *)&f,"",&local_59);
  Write<double>::Write(&out,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write((Write<double> *)&f,&metrics->write_);
  Write<double>::Write(&f.out,&out);
  parallel_for<Omega_h::get_size_isos_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,&f,"get_size_isos");
  Write<double>::Write(&local_28,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  get_size_isos_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&f);
  Write<double>::~Write(&out);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_size_isos_dim(Reals metrics) {
  auto n = divide_no_remainder(metrics.size(), symm_ncomps(dim));
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    out[i] = root<dim>(determinant(m));
  };
  parallel_for(n, f, "get_size_isos");
  return out;
}